

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O0

void __thiscall Shell::TheoryAxioms::addAcyclicityAxiom(TheoryAxioms *this,TermAlgebra *ta)

{
  initializer_list<Kernel::Literal_*> lits;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Stack<Kernel::TermList> *this_00;
  TermAlgebra *in_RSI;
  Literal *sub;
  uint i_1;
  TermStack args;
  uint i;
  bool rec;
  uint pred;
  TermAlgebraConstructor *in_stack_00000170;
  uint in_stack_0000017c;
  TheoryAxioms *in_stack_00000180;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  TermList in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Stack<Kernel::TermList> *in_stack_ffffffffffffff40;
  TermList *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 polarity;
  undefined8 in_stack_ffffffffffffff80;
  uint local_44;
  uint in_stack_ffffffffffffffc8;
  InferenceRule in_stack_ffffffffffffffcf;
  TermList *in_stack_ffffffffffffffd0;
  TermList *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar4;
  uint uVar5;
  
  TermAlgebra::getSubtermPredicate
            ((TermAlgebra *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  bVar1 = TermAlgebra::allowsCyclicTerms(in_RSI);
  if (!bVar1) {
    bVar1 = false;
    uVar4 = 0;
    while (uVar5 = uVar4, uVar3 = TermAlgebra::nConstructors(in_RSI), uVar4 < uVar3) {
      TermAlgebra::constructor
                ((TermAlgebra *)in_stack_ffffffffffffff30._content,in_stack_ffffffffffffff2c);
      bVar2 = addSubtermDefinitions(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
      if (bVar2) {
        bVar1 = true;
      }
      uVar4 = uVar5 + 1;
    }
    if (bVar1) {
      Lib::Stack<Kernel::TermList>::Stack
                (in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_44 = 0;
      while( true ) {
        uVar4 = TermAlgebra::nTypeArgs((TermAlgebra *)0xd1952b);
        polarity = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
        if (uVar4 <= local_44) break;
        Kernel::TermList::TermList
                  ((TermList *)in_stack_ffffffffffffff30._content,in_stack_ffffffffffffff2c,
                   SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0));
        Lib::Stack<Kernel::TermList>::push
                  ((Stack<Kernel::TermList> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   in_stack_ffffffffffffff30);
        local_44 = local_44 + 1;
      }
      TermAlgebra::nTypeArgs((TermAlgebra *)0xd195ae);
      Kernel::TermList::TermList
                ((TermList *)in_stack_ffffffffffffff30._content,in_stack_ffffffffffffff2c,
                 SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0));
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff30);
      TermAlgebra::nTypeArgs((TermAlgebra *)0xd195e7);
      Kernel::TermList::TermList
                ((TermList *)in_stack_ffffffffffffff30._content,in_stack_ffffffffffffff2c,
                 SUB41((uint)in_stack_ffffffffffffff28 >> 0x18,0));
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff30);
      TermAlgebra::nTypeArgs((TermAlgebra *)0xd1962b);
      Lib::Stack<Kernel::TermList>::begin((Stack<Kernel::TermList> *)&stack0xffffffffffffffc0);
      this_00 = (Stack<Kernel::TermList> *)
                Kernel::Literal::create
                          ((uint)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                           (uint)in_stack_ffffffffffffff80,(bool)polarity,in_stack_ffffffffffffff70)
      ;
      lits._M_len._0_4_ = in_stack_ffffffffffffffe0;
      lits._M_array = (iterator)in_stack_ffffffffffffffd8;
      lits._M_len._4_4_ = uVar5;
      addTheoryClauseFromLits
                ((TheoryAxioms *)in_stack_ffffffffffffffd0,lits,in_stack_ffffffffffffffcf,
                 in_stack_ffffffffffffffc8);
      Lib::Stack<Kernel::TermList>::~Stack(this_00);
    }
  }
  return;
}

Assistant:

void TheoryAxioms::addAcyclicityAxiom(TermAlgebra* ta)
{
  unsigned pred = ta->getSubtermPredicate();

  if (ta->allowsCyclicTerms()) {
    return;
  }

  bool rec = false;

  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    if (addSubtermDefinitions(pred, ta->constructor(i))) {
      rec = true;
    }
  }

  // rec <=> the subterm relation is non-empty
  if (!rec) {
    return;
  }

  TermStack args;
  for (unsigned i = 0; i < ta->nTypeArgs(); i++) {
    args.push(TermList(i,false));
  }
  args.push(TermList(ta->nTypeArgs(),false));
  args.push(TermList(ta->nTypeArgs(),false));

  Literal* sub = Literal::create(pred, ta->nTypeArgs()+2, false, args.begin());
  addTheoryClauseFromLits({sub}, InferenceRule::TERM_ALGEBRA_ACYCLICITY_AXIOM,CHEAP);
}